

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O0

void __thiscall CVmVarHeapHybrid_head::~CVmVarHeapHybrid_head(CVmVarHeapHybrid_head *this)

{
  void *in_RDI;
  
  ~CVmVarHeapHybrid_head((CVmVarHeapHybrid_head *)0x379528);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

CVmVarHeapHybrid_head(class CVmVarHeapHybrid *mem_mgr,
                          size_t cell_size, size_t page_count)
    {
        /* remember our memory manager */
        mem_mgr_ = mem_mgr;
        
        /* remember our cell size and number of items per array */
        cell_size_ = cell_size;
        page_count_ = page_count;

        /* we have nothing in our free list yet */
        first_free_ = 0;
    }